

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

Graph * Omega_h::invert_map_by_sorting(Graph *__return_storage_ptr__,LOs *a2b,LO nb)

{
  int *piVar1;
  Alloc *pAVar2;
  LOs ba2ab;
  LOs b2ba;
  Write<int> ba2b;
  LOs local_c8;
  LOs local_b8;
  Alloc *local_a8;
  void *local_a0;
  LOs local_98;
  Write<int> local_88;
  Alloc *local_78;
  void *local_70;
  Read<int> local_68;
  Alloc *local_58;
  void *local_50;
  Read<signed_char> local_48;
  Read<int> local_38;
  
  local_38.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38.write_.shared_alloc_.alloc =
           (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_38.write_.shared_alloc_.alloc)->use_count =
           (local_38.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
  sort_by_keys<int>((Omega_h *)&local_a8,&local_38,1);
  pAVar2 = local_38.write_.shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_38.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_b8.write_.shared_alloc_.alloc = local_a8;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8.write_.shared_alloc_.alloc = (Alloc *)(local_a8->size * 8 + 1);
    }
    else {
      local_a8->use_count = local_a8->use_count + 1;
    }
  }
  local_b8.write_.shared_alloc_.direct_ptr = local_a0;
  local_68.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68.write_.shared_alloc_.alloc =
           (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.write_.shared_alloc_.alloc)->use_count =
           (local_68.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
  unmap<int>((Omega_h *)&local_58,&local_b8,&local_68,1);
  pAVar2 = local_68.write_.shared_alloc_.alloc;
  if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_b8.write_.shared_alloc_.alloc;
  if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_88.shared_alloc_.alloc = local_58;
  if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.shared_alloc_.alloc = (Alloc *)(local_58->size * 8 + 1);
    }
    else {
      local_58->use_count = local_58->use_count + 1;
    }
  }
  local_88.shared_alloc_.direct_ptr = local_50;
  Read<int>::Read(&local_48,&local_88);
  invert_funnel((Omega_h *)&local_78,(LOs *)&local_48,nb);
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
      operator_delete(local_48.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_88.shared_alloc_.alloc;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_c8.write_.shared_alloc_.alloc = local_78;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8.write_.shared_alloc_.alloc = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  local_c8.write_.shared_alloc_.direct_ptr = local_70;
  local_98.write_.shared_alloc_.alloc = local_a8;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc = (Alloc *)(local_a8->size * 8 + 1);
    }
    else {
      local_a8->use_count = local_a8->use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = local_a0;
  Graph::Graph(__return_storage_ptr__,&local_c8,&local_98);
  pAVar2 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_c8.write_.shared_alloc_.alloc;
  if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    piVar1 = &local_78->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78);
      operator_delete(local_78,0x48);
    }
  }
  if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
    piVar1 = &local_58->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58);
      operator_delete(local_58,0x48);
    }
  }
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    piVar1 = &local_a8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8);
      operator_delete(local_a8,0x48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Graph invert_map_by_sorting(LOs a2b, LO nb) {
  auto& ab2b = a2b;
  auto ba2ab = sort_by_keys(ab2b);
  auto ba2b = unmap(ba2ab, ab2b, 1);
  auto b2ba = invert_funnel(ba2b, nb);
  auto& ba2a = ba2ab;
  return Graph(b2ba, ba2a);
}